

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::AVisitor<hiberlite::UpdateBean>::startWalk<X>
          (AVisitor<hiberlite::UpdateBean> *this,X *obj,bean_key *key)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  UpdateBean *this_00;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar3;
  string ClassName;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  _Elt_pointer local_a8;
  _Map_pointer ppSStack_a0;
  undefined1 local_98 [40];
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  (this->rootKey).id = key->id;
  psVar3 = (key->con).res;
  psVar2 = (this->rootKey).con.res;
  if (psVar3 != psVar2) {
    if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &psVar2->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*psVar2->_vptr_shared_cnt_obj_pair[1])();
        psVar3 = (key->con).res;
      }
    }
    (this->rootKey).con.res = psVar3;
    if (psVar3 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar3->refCount = psVar3->refCount + 1;
    }
  }
  local_98._16_8_ = (_Elt_pointer)0x0;
  local_98._24_8_ = (_Map_pointer)0x0;
  local_98._0_8_ = (_Elt_pointer)0x0;
  local_98._8_8_ = (_Elt_pointer)0x0;
  local_a8 = (_Elt_pointer)0x0;
  ppSStack_a0 = (_Map_pointer)0x0;
  local_c8._16_8_ = (_Elt_pointer)0x0;
  local_c8._24_8_ = (_Elt_pointer)0x0;
  local_c8._0_8_ = (_Map_pointer)0x0;
  local_c8._8_8_ = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
  std::_Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::_M_initialize_map
            ((_Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_> *)local_c8,0);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::_M_move_assign1
            (&(this->stack).c,
             (_Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_> *)local_c8);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::~deque
            ((deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_> *)local_c8);
  Database::getClassName<X>();
  local_70 = local_68._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_50 + local_48);
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,local_70,local_70 + local_68._M_allocated_capacity);
  local_a8 = (_Elt_pointer)local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_e8,local_e8 + local_e0);
  local_98._16_8_ = local_98._16_8_ & 0xffffffff00000000;
  std::__cxx11::string::operator=((string *)&this->scope,(string *)local_c8);
  std::__cxx11::string::operator=((string *)&(this->scope)._prefix,(string *)&local_a8);
  (this->scope).prefix_depth = local_98._16_4_;
  if (local_a8 != (_Elt_pointer)local_98) {
    operator_delete(local_a8);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_70 != local_68._M_local_buf + 8) {
    operator_delete(local_70);
  }
  UpdateBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::UpdateBean>>(this->actor,this);
  X::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>(obj,this);
  this_00 = this->actor;
  local_c8._0_8_ = &PTR__shared_res_001d3578;
  local_c8._8_8_ = (this->rootKey).con.res;
  if ((shared_cnt_obj_pair<hiberlite::autoclosed_con> *)local_c8._8_8_ !=
      (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    ((shared_cnt_obj_pair<hiberlite::autoclosed_con> *)local_c8._8_8_)->refCount =
         ((shared_cnt_obj_pair<hiberlite::autoclosed_con> *)local_c8._8_8_)->refCount + 1;
  }
  UpdateBean::commitRow(this_00,(shared_connection *)local_c8,(this->rootKey).id);
  local_c8._0_8_ = &PTR__shared_res_001d3578;
  if ((shared_cnt_obj_pair<hiberlite::autoclosed_con> *)local_c8._8_8_ !=
      (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = (int *)(local_c8._8_8_ + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(*(_func_int ***)local_c8._8_8_)[1])();
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void AVisitor<C>::startWalk(Y& obj, bean_key key)
{
	rootKey=key;
	stack=std::stack<Scope>();
	std::string ClassName=Database::getClassName<Y>();
	scope=Scope(ClassName,"");

	actor->notifyInitWalk(*this);
		walk(obj);
	actor->notifyDoneWalk(*this);
}